

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O3

TPZSavable * __thiscall
TPZRestoreClass<TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra>_>::Restore
          (TPZRestoreClass<TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra>_> *this)

{
  TPZCompElHCurl<pzshape::TPZShapeTetra> *this_00;
  
  this_00 = (TPZCompElHCurl<pzshape::TPZShapeTetra> *)operator_new(200);
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeTetra>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_01963950;
  TPZCompElHCurl<pzshape::TPZShapeTetra>::TPZCompElHCurl(this_00,&PTR_PTR_0195f628);
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeTetra>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElKernelHDiv3D_0195f258;
  *(undefined4 *)&this_00->field_0xc4 = 2;
  return (TPZSavable *)this_00;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }